

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

uint64_t cpu_mapping_to_gpu_addr(cpu_mapping *mapping,uint64_t offset)

{
  ulong uVar1;
  gpu_mapping *pgVar2;
  ulong uVar3;
  
  if ((mapping->object != (gpu_object *)0x0) &&
     (pgVar2 = mapping->object->gpu_mappings, pgVar2 != (gpu_mapping *)0x0)) {
    uVar3 = offset + mapping->object_offset;
    while( true ) {
      uVar1 = pgVar2->object_offset;
      if ((uVar1 <= uVar3) && (uVar3 < uVar1 + pgVar2->length)) break;
      pgVar2 = pgVar2->next;
      if (pgVar2 == (gpu_mapping *)0x0) {
        return 0;
      }
    }
    return (uVar3 - uVar1) + pgVar2->address;
  }
  return 0;
}

Assistant:

uint64_t cpu_mapping_to_gpu_addr(struct cpu_mapping *mapping, uint64_t offset)
{
	uint64_t gpu_addr = 0;
	struct gpu_object *obj = mapping->object;
	uint64_t off = mapping->object_offset + offset;

	if (!obj)
		return 0;

	struct gpu_mapping *gpu_mapping;
	for (gpu_mapping = obj->gpu_mappings; gpu_mapping != NULL; gpu_mapping = gpu_mapping->next)
		if (off >= gpu_mapping->object_offset &&
			off <  gpu_mapping->object_offset + gpu_mapping->length)
			break;

	if (gpu_mapping)
		gpu_addr = gpu_mapping->address + (off - gpu_mapping->object_offset);

	return gpu_addr;
}